

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

Element __thiscall ftxui::vtext(ftxui *this,wstring *text)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<ftxui::(anonymous_namespace)::VText> sVar3;
  Element EVar4;
  undefined1 local_40 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  to_string((string *)(local_40 + 0x10),text);
  sVar3 = std::make_shared<ftxui::(anonymous_namespace)::VText,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  uVar1 = local_40._8_8_;
  _Var2 = sVar3.super___shared_ptr<ftxui::(anonymous_namespace)::VText,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  *(undefined8 *)this = local_40._0_8_;
  *(undefined8 *)(this + 8) = 0;
  local_40._8_8_ = 0;
  *(undefined8 *)(this + 8) = uVar1;
  local_40._0_8_ = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._16_8_ != &local_20) {
    operator_delete((void *)local_40._16_8_,local_20._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX;
  }
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element vtext(std::wstring text) {  // NOLINT
  return std::make_shared<VText>(to_string(text));
}